

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

double nullcGetResultDouble(void)

{
  double local_10;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_10 = 0.0;
  }
  else if (NULLC::currExec == 1) {
    local_10 = ExecutorX86::GetResultDouble(NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    local_10 = ExecutorRegVm::GetResultDouble(NULLC::executorRegVm);
  }
  else {
    local_10 = 0.0;
  }
  return local_10;
}

Assistant:

double nullcGetResultDouble()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0.0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultDouble();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultDouble();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultDouble();
#endif

	return 0.0;
}